

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O3

void __thiscall
Iir::PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8>::PoleFilter
          (PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8> *this)

{
  undefined8 *puVar1;
  long lVar2;
  Storage local_30;
  
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_numPoles = 0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_maxPoles = 0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_pair = (PoleZeroPair *)0x0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.super_Cascade.m_numStages = 0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.super_Cascade.m_maxStages = 0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.super_Cascade.m_stageArray = (Biquad *)0x0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_normalW = 0.0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_normalGain = 1.0;
  ChebyshevI::AnalogLowPass::AnalogLowPass
            (&(this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
              m_analogProto);
  local_30.stageArray = (this->super_CascadeStages<4,_Iir::DirectFormI>).m_stages;
  lVar2 = 0x88;
  do {
    *(undefined8 *)((long)this + lVar2 + -0x28) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)(this->super_CascadeStages<4,_Iir::DirectFormI>).m_stages + lVar2 + -0x80);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(this->super_CascadeStages<4,_Iir::DirectFormI>).m_stages + lVar2 + -0x70);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)((this->super_CascadeStages<4,_Iir::DirectFormI>).m_stages + -2) + lVar2)
         = 0x3ff0000000000000;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x148);
  memset((this->super_CascadeStages<4,_Iir::DirectFormI>).m_states,0,0x200);
  local_30.maxStages = 4;
  Cascade::setCascadeStorage((Cascade *)this,&local_30);
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_numPoles = 0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_maxPoles = 4;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_pair = (this->m_analogStorage).m_pairs;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_numPoles = 0;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_maxPoles = 8;
  (this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_pair = (this->m_digitalStorage).m_pairs;
  *(undefined4 *)
   &(this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalW = 0;
  *(undefined4 *)
   ((long)&(this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalW + 4) = 0;
  *(undefined4 *)
   &(this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalGain = 0;
  *(undefined4 *)
   ((long)&(this->super_BandStopBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalGain + 4) = 0x3ff00000;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[0].m_x2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[0].m_y2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[0].m_x1 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[0].m_y1 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[1].m_x2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[1].m_y2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[1].m_x1 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[1].m_y1 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[2].m_x2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[2].m_y2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[2].m_x1 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[2].m_y1 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[3].m_x2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[3].m_y2 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[3].m_x1 = 0.0;
  (this->super_CascadeStages<4,_Iir::DirectFormI>).m_states[3].m_y1 = 0.0;
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}